

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_cursor.cpp
# Opt level: O1

int Am_Cursor_Data::remove(char *__filename)

{
  Am_Cursor_Data **ppAVar1;
  Am_Cursor_Data *pAVar2;
  Am_Cursor_Data *pAVar3;
  
  ppAVar1 = &list;
  if (list == (Am_Cursor_Data *)0x0) {
    return 0x2f71f0;
  }
  pAVar2 = list;
  if (list == (Am_Cursor_Data *)__filename) {
    pAVar3 = (Am_Cursor_Data *)0x0;
  }
  else {
    do {
      pAVar3 = pAVar2;
      pAVar2 = pAVar3->next;
      if (pAVar2 == (Am_Cursor_Data *)0x0) {
        return 0x2f71f0;
      }
    } while (pAVar2 != (Am_Cursor_Data *)__filename);
  }
  if (pAVar3 != (Am_Cursor_Data *)0x0) {
    ppAVar1 = &pAVar3->next;
  }
  *ppAVar1 = pAVar2->next;
  return (int)ppAVar1;
}

Assistant:

void
Am_Cursor_Data::remove(Am_Cursor_Data *cursor)
{
  Am_Cursor_Data *prev = nullptr;
  Am_Cursor_Data *curr = list;
  while (curr) {
    if (curr == cursor) {
      if (prev)
        prev->next = curr->next;
      else
        list = curr->next;
      return;
    }
    prev = curr;
    curr = curr->next;
  }
}